

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O3

Gen<int> * __thiscall
rc::gen::oneOf<int,int>(Gen<int> *__return_storage_ptr__,gen *this,Gen<int> *gen,Gen<int> *gens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IGenImpl *pIVar3;
  Gen<int> local_78;
  Gen<int> local_50;
  OneOfGen<int> local_28;
  
  local_78.m_impl = *(IGenImpl **)this;
  local_78.m_name._M_dataplus._M_p = (pointer)&local_78.m_name.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x18);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 8) == paVar1) {
    local_78.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.m_name.field_2._8_8_ = *(undefined8 *)(this + 0x20);
  }
  else {
    local_78.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.m_name._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 8);
  }
  local_78.m_name._M_string_length = *(size_type *)(this + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 8) = paVar1;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (gen)0x0;
  *(undefined8 *)this = 0;
  local_50.m_impl = gen->m_impl;
  local_50.m_name._M_dataplus._M_p = (pointer)&local_50.m_name.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(gen->m_name)._M_dataplus._M_p;
  paVar1 = &(gen->m_name).field_2;
  if (paVar2 == paVar1) {
    local_50.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.m_name.field_2._8_8_ = *(undefined8 *)((long)&(gen->m_name).field_2 + 8);
  }
  else {
    local_50.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.m_name._M_dataplus._M_p = (pointer)paVar2;
  }
  local_50.m_name._M_string_length = (gen->m_name)._M_string_length;
  (gen->m_name)._M_dataplus._M_p = (pointer)paVar1;
  (gen->m_name)._M_string_length = 0;
  (gen->m_name).field_2._M_local_buf[0] = '\0';
  gen->m_impl = (IGenImpl *)0x0;
  detail::OneOfGen<int>::OneOfGen<int,int>(&local_28,&local_78,&local_50);
  pIVar3 = (IGenImpl *)operator_new(0x28);
  pIVar3->_vptr_IGenImpl = (_func_int **)&PTR_generate_001b2bb0;
  pIVar3[1]._vptr_IGenImpl =
       (_func_int **)
       local_28.m_gens.super__Vector_base<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  pIVar3[2]._vptr_IGenImpl =
       (_func_int **)
       local_28.m_gens.super__Vector_base<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pIVar3[3]._vptr_IGenImpl =
       (_func_int **)
       local_28.m_gens.super__Vector_base<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_28.m_gens.super__Vector_base<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.m_gens.super__Vector_base<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.m_gens.super__Vector_base<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar3[4]._vptr_IGenImpl = (_func_int **)0x1;
  __return_storage_ptr__->m_impl = pIVar3;
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  std::vector<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>::~vector(&local_28.m_gens);
  Gen<int>::~Gen(&local_50);
  Gen<int>::~Gen(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}